

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

void sparc_release(void *ctx)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *mem;
  
  lVar1 = *(long *)((long)ctx + 0x9968);
  g_free(*(gpointer *)(lVar1 + 0x10));
  g_free(*(gpointer *)(lVar1 + 0x18));
  g_free(*(gpointer *)((long)ctx + 0x9968));
  mem = *(undefined8 **)((long)ctx + 0x10);
  while (mem != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*mem;
    g_free(mem);
    mem = puVar2;
  }
  tcg_pool_reset_sparc64((TCGContext_conflict8 *)ctx);
  g_hash_table_destroy(*(GHashTable **)((long)ctx + 0x98e0));
  g_hash_table_destroy(*(GHashTable **)((long)ctx + 0x98e8));
  g_free(*(gpointer *)((long)ctx + 0x9958));
  g_free(*(gpointer *)(*(long *)((long)ctx + 0x9960) + 0x10));
  g_free(*(gpointer *)((long)ctx + 0x9960));
  g_tree_destroy(*(GTree **)((long)ctx + 0x9938));
  memory_free_sparc64(*(uc_struct_conflict9 **)((long)ctx + 0x9970));
  address_space_destroy_sparc64((AddressSpace *)(*(long *)((long)ctx + 0x9970) + 0x10));
  address_space_destroy_sparc64((AddressSpace *)(*(long *)((long)ctx + 0x9970) + 0x48));
  tb_cleanup_sparc64(*(uc_struct_conflict9 **)((long)ctx + 0x9970));
  free_code_gen_buffer_sparc64(*(uc_struct_conflict9 **)((long)ctx + 0x9970));
  qht_destroy((qht *)((long)ctx + 0x98b8));
  cpu_watchpoint_remove_all_sparc64(*(CPUState **)(*(long *)((long)ctx + 0x9970) + 0x1a0),0x20);
  cpu_breakpoint_remove_all_sparc64(*(CPUState **)(*(long *)((long)ctx + 0x9970) + 0x1a0),0x20);
  return;
}

Assistant:

static void sparc_release(void *ctx)
{
    int i;
    TCGContext *tcg_ctx = (TCGContext *)ctx;
    SPARCCPU *cpu = (SPARCCPU *)tcg_ctx->uc->cpu;
    CPUTLBDesc *d = cpu->neg.tlb.d;
    CPUTLBDescFast *f = cpu->neg.tlb.f;
    CPUTLBDesc *desc;
    CPUTLBDescFast *fast;

    release_common(ctx);
    for (i = 0; i < NB_MMU_MODES; i++) {
        desc = &(d[i]);
        fast = &(f[i]);
        g_free(desc->iotlb);
        g_free(fast->table);
    }
}